

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

int ON_SubDVertex::CompareUnorderedEdges(ON_SubDVertex *a,ON_SubDVertex *b)

{
  ushort uVar1;
  int iVar2;
  
  if (a == (ON_SubDVertex *)0x0) {
    return -(uint)(b != (ON_SubDVertex *)0x0);
  }
  iVar2 = 1;
  if (b != (ON_SubDVertex *)0x0) {
    uVar1 = a->m_edge_count;
    iVar2 = -1;
    if ((b->m_edge_count <= uVar1) && (iVar2 = 1, uVar1 <= b->m_edge_count)) {
      iVar2 = ComparePointerArrays((ulong)uVar1,&a->m_edges->m_ptr,&b->m_edges->m_ptr);
      return iVar2;
    }
  }
  return iVar2;
}

Assistant:

int ON_SubDVertex::CompareUnorderedEdges(
  const ON_SubDVertex* a,
  const ON_SubDVertex* b
  )
{
  if (nullptr == a)
    return ((nullptr == b) ? 0 : -1);
  if (nullptr == b)
    return 1;

  if (a->m_edge_count < b->m_edge_count)
    return -1;
  if (a->m_edge_count > b->m_edge_count)
    return 1;
  return ComparePointerArrays(a->m_edge_count, (const ON__UINT_PTR*)a->m_edges, (const ON__UINT_PTR*)b->m_edges);
}